

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

char * google::protobuf::internal::WireFormat::_InternalParse
                 (Message *msg,char *ptr,ParseContext *ctx)

{
  DescriptorPool *this;
  bool bVar1;
  Descriptor *this_00;
  char *pcVar2;
  FieldDescriptor *field;
  Nonnull<const_char_*> failure_msg;
  int line;
  Reflection *this_01;
  uint number;
  Metadata MVar3;
  MessageSetParser message_set;
  char *local_50;
  MessageSetParser local_48;
  
  local_50 = ptr;
  MVar3 = Message::GetMetadata(msg);
  this_00 = MVar3.descriptor;
  MVar3 = Message::GetMetadata(msg);
  this_01 = MVar3.reflection;
  if (this_00 == (Descriptor *)0x0) {
    failure_msg = "descriptor";
    line = 0x316;
  }
  else {
    if (this_01 != (Reflection *)0x0) {
      if ((this_00->options_->field_0)._impl_.message_set_wire_format_ == false) {
        do {
          bVar1 = ParseContext::Done(ctx,&local_50);
          if (bVar1) {
            return local_50;
          }
          local_50 = ReadTag(local_50,(uint32_t *)&local_48,0);
          if (local_50 == (char *)0x0) break;
          if (((uint)local_48.msg == 0) || (((uint)local_48.msg & 7) == 4)) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = (uint)local_48.msg - 1;
            return local_50;
          }
          number = (uint)local_48.msg >> 3;
          field = Descriptor::FindFieldByNumber(this_00,number);
          if (field == (FieldDescriptor *)0x0) {
            bVar1 = Descriptor::IsExtensionNumber(this_00,number);
            if (bVar1) {
              this = (ctx->data_).pool;
              if (this == (DescriptorPool *)0x0) {
                field = Reflection::FindKnownExtensionByNumber(this_01,number);
              }
              else {
                field = DescriptorPool::FindExtensionByNumber(this,this_00,number);
              }
            }
            else {
              field = (FieldDescriptor *)0x0;
            }
          }
          local_50 = _InternalParseAndMergeField
                               (msg,local_50,ctx,(ulong)local_48.msg & 0xffffffff,this_01,field);
        } while (local_50 != (char *)0x0);
        pcVar2 = (char *)0x0;
      }
      else {
        local_48.msg = msg;
        local_48.descriptor = this_00;
        local_48.reflection = this_01;
        pcVar2 = MessageSetParser::ParseMessageSet(&local_48,ptr,ctx);
      }
      return pcVar2;
    }
    failure_msg = "reflection";
    line = 0x317;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_48);
}

Assistant:

const char* WireFormat::_InternalParse(Message* msg, const char* ptr,
                                       internal::ParseContext* ctx) {
  const Descriptor* descriptor = msg->GetDescriptor();
  const Reflection* reflection = msg->GetReflection();
  ABSL_DCHECK(descriptor);
  ABSL_DCHECK(reflection);
  if (descriptor->options().message_set_wire_format()) {
    MessageSetParser message_set{msg, descriptor, reflection};
    return message_set.ParseMessageSet(ptr, ctx);
  }
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
      ctx->SetLastTag(tag);
      break;
    }
    const FieldDescriptor* field = nullptr;

    int field_number = WireFormatLite::GetTagFieldNumber(tag);
    field = descriptor->FindFieldByNumber(field_number);

    // If that failed, check if the field is an extension.
    if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
      if (ctx->data().pool == nullptr) {
        field = reflection->FindKnownExtensionByNumber(field_number);
      } else {
        field =
            ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
      }
    }

    ptr = _InternalParseAndMergeField(msg, ptr, ctx, tag, reflection, field);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  }
  return ptr;
}